

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md.c
# Opt level: O1

int mbedtls_md_hmac(mbedtls_md_info_t *md_info,uchar *key,size_t keylen,uchar *input,size_t ilen,
                   uchar *output)

{
  int iVar1;
  mbedtls_md_context_t ctx;
  mbedtls_md_context_t local_48;
  
  if (md_info == (mbedtls_md_info_t *)0x0) {
    iVar1 = -0x5100;
  }
  else {
    local_48.md_info = (mbedtls_md_info_t *)0x0;
    local_48.md_ctx = (void *)0x0;
    local_48.hmac_ctx = (void *)0x0;
    iVar1 = mbedtls_md_setup(&local_48,md_info,1);
    if ((iVar1 == 0) && (iVar1 = mbedtls_md_hmac_starts(&local_48,key,keylen), iVar1 == 0)) {
      iVar1 = -0x5100;
      if ((local_48.md_info != (mbedtls_md_info_t *)0x0) && (local_48.hmac_ctx != (void *)0x0)) {
        iVar1 = mbedtls_md_update(&local_48,input,ilen);
      }
      if (iVar1 == 0) {
        iVar1 = mbedtls_md_hmac_finish(&local_48,output);
      }
    }
    mbedtls_md_free(&local_48);
  }
  return iVar1;
}

Assistant:

int mbedtls_md_hmac( const mbedtls_md_info_t *md_info,
                     const unsigned char *key, size_t keylen,
                     const unsigned char *input, size_t ilen,
                     unsigned char *output )
{
    mbedtls_md_context_t ctx;
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    if( md_info == NULL )
        return( MBEDTLS_ERR_MD_BAD_INPUT_DATA );

    mbedtls_md_init( &ctx );

    if( ( ret = mbedtls_md_setup( &ctx, md_info, 1 ) ) != 0 )
        goto cleanup;

    if( ( ret = mbedtls_md_hmac_starts( &ctx, key, keylen ) ) != 0 )
        goto cleanup;
    if( ( ret = mbedtls_md_hmac_update( &ctx, input, ilen ) ) != 0 )
        goto cleanup;
    if( ( ret = mbedtls_md_hmac_finish( &ctx, output ) ) != 0 )
        goto cleanup;

cleanup:
    mbedtls_md_free( &ctx );

    return( ret );
}